

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O2

int bid_keyword_list(char *p,ssize_t len,int unset,int last_is_path)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  char *p_00;
  byte bVar10;
  undefined8 *puVar11;
  
  iVar8 = 0;
  do {
    do {
      if (len < 1) {
        return iVar8;
      }
      if (*p == '\0') {
        return iVar8;
      }
      pcVar1 = p + len;
      bVar10 = 0;
      for (; 0 < len; len = len + -1) {
        cVar2 = *p;
        if ((cVar2 != ' ') && (p_00 = p, cVar2 != '\t')) goto LAB_00154d43;
        p = p + 1;
        bVar10 = 1;
      }
      cVar2 = *pcVar1;
      len = 0;
      p_00 = pcVar1;
LAB_00154d43:
      cVar3 = cVar2;
      if (cVar2 == '\\') {
        cVar3 = p_00[1];
      }
      if (cVar3 == '\n') {
        return iVar8;
      }
      if (cVar3 == '\r') {
        return iVar8;
      }
      if ((bool)(last_is_path == 0 & (bVar10 ^ 1))) {
        return -1;
      }
      if ((last_is_path != 0) && (len == 0)) {
        return iVar8;
      }
      if ((unset != 0) && (iVar5 = bid_keycmp(p_00,"all",len), 0 < iVar5)) {
        return 1;
      }
      bVar10 = cVar2 + 0x9d;
      if (0x12 < bVar10) {
        return -1;
      }
      if ((0x79e5bU >> (bVar10 & 0x1f) & 1) == 0) {
        return -1;
      }
      puVar11 = (undefined8 *)(&DAT_001ad130 + *(int *)(&DAT_001ad130 + (ulong)bVar10 * 4));
      do {
        if ((char *)*puVar11 == (char *)0x0) {
          return -1;
        }
        uVar6 = bid_keycmp(p_00,(char *)*puVar11,len);
        puVar11 = puVar11 + 1;
      } while ((int)uVar6 < 1);
      uVar7 = (ulong)uVar6;
      p = p_00 + uVar7;
      len = len - uVar7;
      iVar8 = iVar8 + 1;
    } while (p_00[uVar7] != '=');
    p = p_00 + uVar7;
    bVar10 = 0;
    do {
      bVar4 = bVar10;
      lVar9 = len;
      p = p + 1;
      if ((lVar9 < 2) || (*p == ' ')) break;
      len = lVar9 + -1;
      bVar10 = 1;
    } while (*p != '\t');
    len = lVar9 + -1;
    if (!(bool)(unset != 0 | bVar4)) {
      return -1;
    }
  } while( true );
}

Assistant:

static int
bid_keyword_list(const char *p,  ssize_t len, int unset, int last_is_path)
{
	int l;
	int keycnt = 0;

	while (len > 0 && *p) {
		int blank = 0;

		/* Test whether there are blank characters in the line. */
		while (len >0 && (*p == ' ' || *p == '\t')) {
			++p;
			--len;
			blank = 1;
		}
		if (*p == '\n' || *p == '\r')
			break;
		if (p[0] == '\\' && (p[1] == '\n' || p[1] == '\r'))
			break;
		if (!blank && !last_is_path) /* No blank character. */
			return (-1);
		if (last_is_path && len == 0)
				return (keycnt);

		if (unset) {
			l = bid_keycmp(p, "all", len);
			if (l > 0)
				return (1);
		}
		/* Test whether there is a correct key in the line. */
		l = bid_keyword(p, len);
		if (l == 0)
			return (-1);/* Unknown keyword was found. */
		p += l;
		len -= l;
		keycnt++;

		/* Skip value */
		if (*p == '=') {
			int value = 0;
			++p;
			--len;
			while (len > 0 && *p != ' ' && *p != '\t') {
				++p;
				--len;
				value = 1;
			}
			/* A keyword should have a its value unless
			 * "/unset" operation. */ 
			if (!unset && value == 0)
				return (-1);
		}
	}
	return (keycnt);
}